

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_as_strings.h
# Opt level: O0

string * join_as_strings<ezy::detail::drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>,____C_A_T_C_H____T_E_S_T____141()::__0>&>
                   (string *__return_storage_ptr__,
                   drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>
                   *range,string_view separator)

{
  basic_string_view<char,_std::char_traits<char>_> *separator_00;
  result_range_type local_38;
  drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>
  *local_28;
  drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>
  *range_local;
  string_view separator_local;
  
  separator_00 = (basic_string_view<char,_std::char_traits<char>_> *)separator._M_str;
  range_local = (drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>
                 *)separator._M_len;
  local_28 = range;
  separator_local._M_len = (size_t)separator_00;
  separator_local._M_str = (char *)__return_storage_ptr__;
  local_38 = ezy::
             transform<ezy::detail::drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>,____C_A_T_C_H____T_E_S_T____141()::__0>&,ezy::to_string_fn_const&>
                       (range,(to_string_fn *)&ezy::cpo::to_string);
  ezy::
  join<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>,____C_A_T_C_H____T_E_S_T____141()::__0>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>
            (__return_storage_ptr__,(ezy *)&local_38,
             (range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>_>,_const_ezy::to_string_fn_&>
              *)&range_local,separator_00);
  return __return_storage_ptr__;
}

Assistant:

std::string
join_as_strings(Range&& range, std::string_view separator = "")
{
  return ezy::join(ezy::transform(std::forward<Range>(range), ezy::to_string), separator);
}